

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O3

bool __thiscall
duckdb::roaring::RoaringCompressState::CanStore
          (RoaringCompressState *this,idx_t container_size,ContainerMetadata *metadata)

{
  ContainerType CVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t run_containers;
  long lVar4;
  
  CVar1 = metadata->container_type;
  lVar4 = 0;
  if (CVar1 == BITSET_CONTAINER) {
    lVar4 = ((ulong)(this->data_ptr + 7) & 0xfffffffffffffff8) - (long)this->data_ptr;
  }
  iVar2 = ContainerMetadata::GetDataSizeInBytes(metadata,container_size);
  run_containers = (ulong)(CVar1 == RUN_CONTAINER) + (this->metadata_collection).runs_in_segment;
  iVar3 = (ulong)(CVar1 != RUN_CONTAINER) + (this->metadata_collection).arrays_in_segment;
  iVar3 = ContainerMetadataCollection::GetMetadataSize
                    ((ContainerMetadataCollection *)metadata,iVar3 + run_containers,run_containers,
                     iVar3);
  return iVar2 + lVar4 + iVar3 <= (ulong)((long)this->metadata_ptr - (long)this->data_ptr);
}

Assistant:

bool RoaringCompressState::CanStore(idx_t container_size, const ContainerMetadata &metadata) {
	idx_t required_space = 0;
	if (metadata.IsUncompressed()) {
		// Account for the alignment we might need for this container
		required_space += (AlignValue<idx_t>(reinterpret_cast<idx_t>(data_ptr))) - reinterpret_cast<idx_t>(data_ptr);
	}
	required_space += metadata.GetDataSizeInBytes(container_size);

	idx_t runs_count = metadata_collection.GetRunContainerCount();
	idx_t arrays_count = metadata_collection.GetArrayAndBitsetContainerCount();
#ifdef DEBUG
	idx_t current_size = metadata_collection.GetMetadataSize(runs_count + arrays_count, runs_count, arrays_count);
	(void)current_size;
	D_ASSERT(required_space + current_size <= GetRemainingSpace());
#endif
	if (metadata.IsRun()) {
		runs_count++;
	} else {
		arrays_count++;
	}
	idx_t metadata_size = metadata_collection.GetMetadataSize(runs_count + arrays_count, runs_count, arrays_count);
	required_space += metadata_size;

	if (required_space > GetRemainingSpace()) {
		return false;
	}
	return true;
}